

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  PagerSavepoint *pSavepoint;
  Pager *in_stack_00000018;
  int nNew;
  int ii;
  int rc;
  i64 in_stack_ffffffffffffffc8;
  Bitvec *in_stack_ffffffffffffffd0;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RDI + 0x2c);
  if ((local_14 == 0) && (in_EDX < *(int *)(in_RDI + 0x80))) {
    iVar1 = in_EDX + (uint)(in_ESI != 1);
    for (local_18 = iVar1; local_18 < *(int *)(in_RDI + 0x80); local_18 = local_18 + 1) {
      sqlite3BitvecDestroy(in_stack_ffffffffffffffd0);
    }
    *(int *)(in_RDI + 0x80) = iVar1;
    if (in_ESI == 1) {
      if ((iVar1 == 0) && (**(long **)(in_RDI + 0x58) != 0)) {
        iVar1 = sqlite3JournalIsInMemory(*(sqlite3_file **)(in_RDI + 0x58));
        if (iVar1 != 0) {
          local_14 = sqlite3OsTruncate((sqlite3_file *)in_stack_ffffffffffffffd0,
                                       in_stack_ffffffffffffffc8);
        }
        *(undefined4 *)(in_RDI + 0x38) = 0;
      }
    }
    else if ((*(long *)(in_RDI + 0x120) != 0) || (**(long **)(in_RDI + 0x50) != 0)) {
      local_14 = pagerPlaybackSavepoint(in_stack_00000018,pSavepoint);
    }
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;
  
#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated 
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* If this is a release of the outermost savepoint, truncate 
    ** the sub-journal to zero bytes in size. */
    if( op==SAVEPOINT_RELEASE ){
      if( nNew==0 && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          rc = sqlite3OsTruncate(pPager->sjfd, 0);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = 0;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }
    
#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled 
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if( 
        pPager->journalMode==PAGER_JOURNALMODE_OFF 
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}